

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-use.c
# Opt level: O0

_Bool borg_quaff_crit(_Bool no_check)

{
  _Bool _Var1;
  uint32_t uVar2;
  _Bool local_9;
  _Bool no_check_local;
  
  if (no_check) {
    _Var1 = borg_quaff_potion(sv_potion_cure_critical);
    if (_Var1) {
      borg_quaff_crit::when_last_quaff = borg_t;
      local_9 = true;
    }
    else {
      local_9 = false;
    }
  }
  else {
    if (((borg_t + -4 < (int)borg_quaff_crit::when_last_quaff) &&
        (borg_quaff_crit::when_last_quaff <= borg_t)) &&
       (uVar2 = Rand_div(100), (int)(uVar2 + 1) < 0x4b)) {
      return false;
    }
    if (borg.trait[0xe7] < 2) {
      local_9 = false;
    }
    else {
      _Var1 = borg_quaff_potion(sv_potion_cure_critical);
      if (_Var1) {
        borg_quaff_crit::when_last_quaff = borg_t;
        local_9 = true;
      }
      else {
        local_9 = false;
      }
    }
  }
  return local_9;
}

Assistant:

bool borg_quaff_crit(bool no_check)
{
    static int16_t when_last_quaff = 0;

    if (no_check) {
        if (borg_quaff_potion(sv_potion_cure_critical)) {
            when_last_quaff = borg_t;
            return true;
        }
        return false;
    }

    /* Avoid drinking CCW twice in a row */
    if (when_last_quaff > (borg_t - 4) && when_last_quaff <= borg_t
        && (randint1(100) < 75))
        return false;

    /* Save the last two for when we really need them */
    if (borg.trait[BI_ACCW] < 2)
        return false;

    if (borg_quaff_potion(sv_potion_cure_critical)) {
        when_last_quaff = borg_t;
        return true;
    }
    return false;
}